

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

string_type * __thiscall
toml::detail::serializer<toml::type_config>::escape_ml_basic_string
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,string_type *s)

{
  byte __c;
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  char cVar4;
  size_type __pos;
  int iVar5;
  char *__end_1;
  size_type sVar6;
  char *__end;
  long *local_68;
  size_type local_60;
  long local_58 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  serializer<toml::type_config> *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = s->_M_string_length;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__;
  local_40 = this;
  if (sVar1 != 0) {
    pcVar2 = (s->_M_dataplus)._M_p;
    sVar6 = 0;
    do {
      __c = pcVar2[sVar6];
      switch(__c) {
      case 8:
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\\b","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append(local_48,(char *)local_68,local_60);
        break;
      case 9:
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\\t","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append(local_48,(char *)local_68,local_60);
        break;
      case 10:
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\n","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append(local_48,(char *)local_68,local_60);
        break;
      case 0xb:
switchD_003eeccf_caseD_b:
        iVar5 = (int)(char)__c;
        if ((__c < 9) || (__c == 0x7f || (byte)(__c - 10) < 0x16)) {
          if ((local_40->spec_).v1_1_0_add_escape_sequence_x == true) {
            local_68 = local_58;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\\x","");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(local_48,(char *)local_68,local_60);
          }
          else {
            local_68 = local_58;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\\u00","");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(local_48,(char *)local_68,local_60);
          }
          if (local_68 != local_58) {
            operator_delete(local_68,local_58[0] + 1);
          }
          iVar3 = iVar5 + 0xf;
          if (-1 < (char)__c) {
            iVar3 = iVar5;
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(local_48,(char)(iVar3 >> 4) + '0');
          cVar4 = '7';
          if (iVar5 % 0x10 < 10) {
            cVar4 = '0';
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(local_48,cVar4 + (char)(iVar5 % 0x10));
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(local_48,__c);
        }
        goto LAB_003eef50;
      case 0xc:
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\\f","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append(local_48,(char *)local_68,local_60);
        break;
      case 0xd:
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\\r","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append(local_48,(char *)local_68,local_60);
        break;
      default:
        if (__c == 0x1b) {
          if ((local_40->spec_).v1_1_0_add_escape_sequence_e != true) goto switchD_003eeccf_caseD_b;
          local_68 = local_58;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\\e","");
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append(local_48,(char *)local_68,local_60);
        }
        else {
          if (__c != 0x5c) goto switchD_003eeccf_caseD_b;
          local_68 = local_58;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\\\\","");
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append(local_48,(char *)local_68,local_60);
        }
      }
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0] + 1);
      }
LAB_003eef50:
      sVar6 = sVar6 + 1;
    } while (sVar1 != sVar6);
  }
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\"\"\"","");
  __pos = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (local_48,(char *)local_68,0,local_60);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  while (__pos != 0xffffffffffffffff) {
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\"\"\\\"","");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (local_48,__pos,3,(char *)local_68,local_60);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\"\"\"","");
    __pos = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find(local_48,(char *)local_68,0,local_60);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
  }
  return (string_type *)local_48;
}

Assistant:

string_type escape_ml_basic_string(const string_type& s) // {{{
    {
        string_type retval;
        for(const char_type c : s)
        {
            switch(c)
            {
                case char_type('\\'): {retval += string_conv<string_type>("\\\\"); break;}
                case char_type('\b'): {retval += string_conv<string_type>("\\b" ); break;}
                case char_type('\t'): {retval += string_conv<string_type>("\\t" ); break;}
                case char_type('\f'): {retval += string_conv<string_type>("\\f" ); break;}
                case char_type('\n'): {retval += string_conv<string_type>("\n"  ); break;}
                case char_type('\r'): {retval += string_conv<string_type>("\\r" ); break;}
                default  :
                {
                    if(c == char_type(0x1B) && spec_.v1_1_0_add_escape_sequence_e)
                    {
                        retval += string_conv<string_type>("\\e");
                    }
                    else if((char_type(0x00) <= c && c <= char_type(0x08)) ||
                            (char_type(0x0A) <= c && c <= char_type(0x1F)) ||
                            c == char_type(0x7F))
                    {
                        if(spec_.v1_1_0_add_escape_sequence_x)
                        {
                            retval += string_conv<string_type>("\\x");
                        }
                        else
                        {
                            retval += string_conv<string_type>("\\u00");
                        }
                        const auto c1 = c / 16;
                        const auto c2 = c % 16;
                        retval += static_cast<char_type>('0' + c1);
                        if(c2 < 10)
                        {
                            retval += static_cast<char_type>('0' + c2);
                        }
                        else // 10 <= c2
                        {
                            retval += static_cast<char_type>('A' + (c2 - 10));
                        }
                    }
                    else
                    {
                        retval += c;
                    }
                }
            }
        }
        // Only 1 or 2 consecutive `"`s are allowed in multiline basic string.
        // 3 consecutive `"`s are considered as a closing delimiter.
        // We need to check if there are 3 or more consecutive `"`s and insert
        // backslash to break them down into several short `"`s like the `str6`
        // in the following example.
        // ```toml
        // str4 = """Here are two quotation marks: "". Simple enough."""
        // # str5 = """Here are three quotation marks: """."""  # INVALID
        // str5 = """Here are three quotation marks: ""\"."""
        // str6 = """Here are fifteen quotation marks: ""\"""\"""\"""\"""\"."""
        // ```
        auto found_3_quotes = retval.find(string_conv<string_type>("\"\"\""));
        while(found_3_quotes != string_type::npos)
        {
            retval.replace(found_3_quotes, 3, string_conv<string_type>("\"\"\\\""));
            found_3_quotes = retval.find(string_conv<string_type>("\"\"\""));
        }
        return retval;
    }